

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O3

bool __thiscall
prevector<8U,_int,_unsigned_int,_int>::operator==
          (prevector<8U,_int,_unsigned_int,_int> *this,prevector<8U,_int,_unsigned_int,_int> *other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  
  uVar1 = other->_size;
  uVar3 = uVar1 - 9;
  if (uVar1 < 9) {
    uVar3 = uVar1;
  }
  uVar2 = this->_size;
  uVar4 = uVar2 - 9;
  if (uVar2 < 9) {
    uVar4 = uVar2;
  }
  if (uVar3 == uVar4) {
    if (8 < uVar2) {
      this = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
    }
    if (uVar3 == 0) {
      bVar6 = true;
    }
    else {
      if (8 < uVar1) {
        other = (prevector<8U,_int,_unsigned_int,_int> *)(other->_union).indirect_contents.indirect;
      }
      lVar5 = 0;
      do {
        bVar6 = *(int *)((long)&this->_union + lVar5) == *(int *)((long)&other->_union + lVar5);
        if (!bVar6) break;
        bVar7 = (long)(int)uVar3 * 4 + -4 != lVar5;
        lVar5 = lVar5 + 4;
      } while (bVar7);
    }
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool operator==(const prevector<N, T, Size, Diff>& other) const {
        if (other.size() != size()) {
            return false;
        }
        const_iterator b1 = begin();
        const_iterator b2 = other.begin();
        const_iterator e1 = end();
        while (b1 != e1) {
            if ((*b1) != (*b2)) {
                return false;
            }
            ++b1;
            ++b2;
        }
        return true;
    }